

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::RuleBasedCollator::setVariableTop
          (RuleBasedCollator *this,uint32_t varTop,UErrorCode *errorCode)

{
  bool bVar1;
  int32_t iVar2;
  CollationSettings *this_00;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if (this->settings->variableTop == varTop) goto LAB_00221f8b;
  iVar2 = CollationData::getGroupForPrimary(this->data,varTop);
  if (iVar2 - 0x1004U < 0xfffffffc) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
LAB_00221f67:
    bVar1 = false;
  }
  else {
    varTop = CollationData::getLastPrimaryForGroup(this->data,iVar2);
    bVar1 = true;
    if (varTop != this->settings->variableTop) {
      this_00 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
      if (this_00 == (CollationSettings *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        CollationSettings::setMaxVariable
                  (this_00,iVar2 + -0x1000,this->tailoring->settings->options,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          this_00->variableTop = varTop;
          iVar2 = CollationFastLatin::getOptions
                            (this->data,this_00,this_00->fastLatinPrimaries,0x180);
          this_00->fastLatinOptions = iVar2;
          goto LAB_00221f86;
        }
      }
      goto LAB_00221f67;
    }
  }
LAB_00221f86:
  if (!bVar1) {
    return;
  }
LAB_00221f8b:
  this->explicitlySetAttributes =
       (uint)(varTop != this->tailoring->settings->variableTop) << 8 |
       this->explicitlySetAttributes & 0xfffffeff;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }